

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  int worldSize;
  int myRank;
  int argc_local;
  char **argv_local;
  MPI_Status status;
  char msg [100];
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  myRank = 0;
  worldSize = 0;
  MPI_Comm_rank(&ompi_mpi_comm_world,&myRank);
  MPI_Comm_size(&ompi_mpi_comm_world,&worldSize);
  sprintf(msg,"Hi, I am CPU %d!",(ulong)(uint)myRank);
  sVar1 = strlen(msg);
  MPI_Send(msg,(int)sVar1 + 1,&ompi_mpi_char,(long)(myRank + 1) % (long)worldSize & 0xffffffff,0,
           &ompi_mpi_comm_world);
  MPI_Recv(msg,100,&ompi_mpi_char,0xffffffffffffffff,0xffffffff,&ompi_mpi_comm_world,&status);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nI am CPU ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,myRank);
  poVar2 = std::operator<<(poVar2,". The CPU ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,status.MPI_SOURCE);
  poVar2 = std::operator<<(poVar2," told me: ");
  poVar2 = std::operator<<(poVar2,msg);
  poVar2 = std::operator<<(poVar2,"\nStatus.MPI_SOURCE = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,status.MPI_SOURCE);
  poVar2 = std::operator<<(poVar2,"\nStatus.MPI_TAG = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,status.MPI_TAG);
  poVar2 = std::operator<<(poVar2,"\nStatus.MPI_ERROR = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,status.MPI_ERROR);
  std::endl<char,std::char_traits<char>>(poVar2);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    MPI_Init(&argc, &argv);

    int myRank{}, worldSize{};
    MPI_Comm_rank(MPI_COMM_WORLD, &myRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    char msg[100];
    sprintf(msg, "Hi, I am CPU %d!", myRank);
    MPI_Send(msg, strlen(msg) + 1, MPI_CHAR, (myRank + 1) % worldSize, 0, MPI_COMM_WORLD);

    MPI_Status status;
    MPI_Recv(msg, 100, MPI_CHAR, MPI_ANY_SOURCE, MPI_ANY_TAG, MPI_COMM_WORLD, &status);

    cout << "\nI am CPU " << myRank << ". The CPU " << status.MPI_SOURCE << " told me: " << msg 
         << "\nStatus.MPI_SOURCE = " << status.MPI_SOURCE
         << "\nStatus.MPI_TAG = "<< status.MPI_TAG
         << "\nStatus.MPI_ERROR = "<< status.MPI_ERROR << endl;

    MPI_Finalize();
    return 0;
}